

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O3

size_t default_decrypt_cid(quicly_cid_encryptor_t *_self,quicly_cid_plaintext_t *plaintext,
                          void *encrypted,size_t len)

{
  uint uVar1;
  _func_size_t_st_quicly_cid_encryptor_t_ptr_quicly_cid_plaintext_t_ptr_void_ptr_size_t *p_Var2;
  size_t sVar3;
  size_t sVar4;
  ulong *puVar5;
  ulong uVar6;
  uint8_t ptbuf [16];
  ulong local_28;
  uint local_20 [2];
  
  puVar5 = &local_28;
  p_Var2 = _self[1].decrypt_cid;
  sVar3 = *(size_t *)(*(long *)p_Var2 + 0x10);
  if ((len == 0) ||
     (sVar4 = 0xffffffffffffffff, sVar3 = len, *(size_t *)(*(long *)p_Var2 + 0x10) == len)) {
    sVar4 = sVar3;
    (**(code **)(p_Var2 + 0x18))(p_Var2,&local_28);
    if (sVar4 == 0x10) {
      puVar5 = (ulong *)local_20;
      uVar6 = local_28 >> 0x38 | (local_28 & 0xff000000000000) >> 0x28 |
              (local_28 & 0xff0000000000) >> 0x18 | (local_28 & 0xff00000000) >> 8 |
              (local_28 & 0xff000000) << 8 | (local_28 & 0xff0000) << 0x18 |
              (local_28 & 0xff00) << 0x28 | local_28 << 0x38;
    }
    else {
      uVar6 = 0;
    }
    plaintext->node_id = uVar6;
    uVar1 = *(uint *)puVar5;
    plaintext->master_id =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)((long)puVar5 + 4);
    *(uint *)&plaintext->field_0x4 =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if ((long)puVar5 + (8 - (long)&local_28) != sVar4) {
      __assert_fail("p - ptbuf == len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                    ,0xad,
                    "size_t default_decrypt_cid(quicly_cid_encryptor_t *, quicly_cid_plaintext_t *, const void *, size_t)"
                   );
    }
  }
  return sVar4;
}

Assistant:

static size_t default_decrypt_cid(quicly_cid_encryptor_t *_self, quicly_cid_plaintext_t *plaintext, const void *encrypted,
                                  size_t len)
{
    struct st_quicly_default_encrypt_cid_t *self = (void *)_self;
    uint8_t ptbuf[16];
    const uint8_t *p;

    if (len != 0) {
        /* long header packet; decrypt only if given Connection ID matches the expected size */
        if (len != self->cid_decrypt_ctx->algo->block_size)
            return SIZE_MAX;
    } else {
        /* short header packet; we are the one to name the size */
        len = self->cid_decrypt_ctx->algo->block_size;
    }

    /* decrypt */
    ptls_cipher_encrypt(self->cid_decrypt_ctx, ptbuf, encrypted, len);

    /* decode */
    p = ptbuf;
    if (len == 16) {
        plaintext->node_id = quicly_decode64(&p);
    } else {
        plaintext->node_id = 0;
    }
    plaintext->master_id = quicly_decode32(&p);
    plaintext->thread_id = quicly_decode24(&p);
    plaintext->path_id = *p++;
    assert(p - ptbuf == len);

    return len;
}